

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

string * HelpMessageOpt(string *__return_storage_ptr__,string *option,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  string_view in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.field_2._M_allocated_capacity._0_2_ = 0x2020;
  local_d8._M_string_length = 2;
  local_d8.field_2._M_local_buf[2] = '\0';
  paVar2 = &local_f8.field_2;
  pcVar3 = (option->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + option->_M_string_length);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    uVar8 = CONCAT53(local_d8.field_2._M_allocated_capacity._3_5_,
                     CONCAT12(local_d8.field_2._M_local_buf[2],
                              local_d8.field_2._M_allocated_capacity._0_2_));
  }
  if (uVar8 < local_f8._M_string_length + local_d8._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      uVar7 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_f8._M_string_length + local_d8._M_string_length) goto LAB_0032f302;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  }
  else {
LAB_0032f302:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar4 == paVar1) {
    local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_b8.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b8._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"\n","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar7 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_118._M_string_length + local_b8._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar7 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_118._M_string_length + local_b8._M_string_length) goto LAB_0032f3df;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_118,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  }
  else {
LAB_0032f3df:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b8,local_118._M_dataplus._M_p,local_118._M_string_length);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar4 == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)paVar4;
  }
  local_98._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  paVar1 = &local_138.field_2;
  local_138.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_138._M_string_length = 7;
  local_138.field_2._M_allocated_capacity._4_4_ = 0x202020;
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    uVar7 = local_98.field_2._M_allocated_capacity;
  }
  local_138._M_dataplus._M_p = (pointer)paVar1;
  if ((local_98._M_string_length + 7 < 0x10) && ((ulong)uVar7 < local_98._M_string_length + 7)) {
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_138,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
  }
  else {
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_98,paVar1->_M_local_buf,7);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar4 = &pbVar6->field_2;
  if (paVar5 == paVar4) {
    local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)paVar5;
  }
  local_78._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar6->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  in._M_str = (message->_M_dataplus)._M_p;
  in._M_len = message->_M_string_length;
  FormatParagraph_abi_cxx11_(&local_158,in,0x48,7);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    uVar7 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_158._M_string_length + local_78._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      uVar7 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_158._M_string_length + local_78._M_string_length) goto LAB_0032f584;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_158,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
LAB_0032f584:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,local_158._M_dataplus._M_p,local_158._M_string_length);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar4 = &pbVar6->field_2;
  if (paVar5 == paVar4) {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_58.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
    local_58.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar5;
  }
  local_58._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar6->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  paVar4 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\n\n","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    uVar7 = local_58.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_178._M_string_length + local_58._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar4) {
      uVar7 = local_178.field_2._M_allocated_capacity;
    }
    if (local_178._M_string_length + local_58._M_string_length <= (ulong)uVar7) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_178,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
      goto LAB_0032f677;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_58,local_178._M_dataplus._M_p,local_178._M_string_length);
LAB_0032f677:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  paVar5 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar5) {
    uVar7 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar6->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar4) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT44(local_138.field_2._M_allocated_capacity._4_4_,
                             local_138.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT53(local_d8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_d8.field_2._M_local_buf[2],
                                      local_d8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpMessageOpt(const std::string &option, const std::string &message) {
    return std::string(optIndent,' ') + std::string(option) +
           std::string("\n") + std::string(msgIndent,' ') +
           FormatParagraph(message, screenWidth - msgIndent, msgIndent) +
           std::string("\n\n");
}